

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O0

string * dd::GetCurrentDir_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_41a;
  undefined1 local_419;
  char local_418 [8];
  char buf [1024];
  int bufLen;
  string *str;
  
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\x04';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  GetCurrentDir(local_418,0x400);
  local_419 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,local_418,&local_41a);
  std::allocator<char>::~allocator(&local_41a);
  return in_RDI;
}

Assistant:

std::string GetCurrentDir()
	{
		int bufLen = 1024;
		char buf[1024];
		GetCurrentDir(buf, bufLen);
		std::string str = buf;
		return str;
	}